

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkIvyAfter(Abc_Ntk_t *pNtk,Ivy_Man_t *pMan,int fSeq,int fHaig)

{
  uint uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int fCleanup;
  int nNodes;
  Abc_Ntk_t *pNtkAig;
  int fHaig_local;
  int fSeq_local;
  Ivy_Man_t *pMan_local;
  Abc_Ntk_t *pNtk_local;
  
  if (fSeq == 0) {
    _fCleanup = Abc_NtkFromIvy(pNtk,pMan);
  }
  else {
    _fCleanup = Abc_NtkFromIvySeq(pNtk,pMan,fHaig);
  }
  if ((fHaig == 0) && (uVar1 = Abc_AigCleanup((Abc_Aig_t *)_fCleanup->pManFunc), uVar1 != 0)) {
    printf("Warning: AIG cleanup removed %d nodes (this is not a bug).\n",(ulong)uVar1);
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar3 = Abc_NtkDup(pNtk->pExdc);
    _fCleanup->pExdc = pAVar3;
  }
  iVar2 = Abc_NtkCheck(_fCleanup);
  if (iVar2 == 0) {
    printf("Abc_NtkStrash: The network check has failed.\n");
    Abc_NtkDelete(_fCleanup);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_local = _fCleanup;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyAfter( Abc_Ntk_t * pNtk, Ivy_Man_t * pMan, int fSeq, int fHaig )
{
    Abc_Ntk_t * pNtkAig;
    int nNodes, fCleanup = 1;
    // convert from the AIG manager
    if ( fSeq )
        pNtkAig = Abc_NtkFromIvySeq( pNtk, pMan, fHaig );
    else
        pNtkAig = Abc_NtkFromIvy( pNtk, pMan );
    // report the cleanup results
    if ( !fHaig && fCleanup && (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) )
        printf( "Warning: AIG cleanup removed %d nodes (this is not a bug).\n", nNodes );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}